

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O3

bool __thiscall ScParser::parseFunctionDecl(ScParser *this,char **data)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  char *__s1_00;
  
  this->m_hasCurrentState = false;
  __s1 = *data;
  iVar2 = strncmp(__s1,"boost::statechart::",0x13);
  if (iVar2 != 0) {
    bVar1 = parseReactMethod(this,data);
    return bVar1;
  }
  __s1_00 = __s1 + 0x13;
  *data = __s1_00;
  iVar2 = strncmp(__s1_00,"detail::reaction_result boost::statechart::",0x2b);
  if (iVar2 == 0) {
    __s1_00 = __s1 + 0x3e;
    *data = __s1_00;
  }
  iVar2 = strncmp(__s1_00,"state_machine<",0xe);
  if (iVar2 == 0) {
    *data = __s1_00 + 0xe;
    parseStateMachine(this,data);
  }
  else {
    iVar2 = strncmp(__s1_00,"simple_state<",0xd);
    if (iVar2 != 0) {
      return false;
    }
    *data = __s1_00 + 0xd;
    parseSimpleState(this,data);
  }
  return true;
}

Assistant:

bool ScParser::parseFunctionDecl(char *&data)
{
    m_hasCurrentState = false;

    // boost::statechart::detail::reaction_result
    //     boost::statechart::simple_state< *state-spec* >::
    //         local_react<boost::mpl::list<
    //                         boost::statechart::custom_reaction< *event-name* >,
    //                         boost::statechart::deferral< * event-name * >,
    //                         mpl_::na, ..., mpl_::na> >(
    //                            boost::statechart::event_base const&, void const*)>

    if (expectStartsWith(data, "boost::statechart::")) {
        expectStartsWith(data, "detail::reaction_result boost::statechart::");
        // boost::statechart::state_machine<fsm::StateMachine, fsm::NotStarted, ...
        if (expectStartsWith(data, "state_machine<")) {
            parseStateMachine(data);
            return true;
        }
        // boost::statechart::simple_state<fsm::NotStarted, fsm::StateMachine, ...
        if (expectStartsWith(data, "simple_state<")) {
            parseSimpleState(data);
            return true;
        }
        return false;
    }
    return parseReactMethod(data);
}